

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<ON__CNewMeshFace>::Append(ON_SimpleArray<ON__CNewMeshFace> *this,ON__CNewMeshFace *x)

{
  int iVar1;
  void *temp;
  ON__CNewMeshFace *pOStack_20;
  int newcapacity;
  ON__CNewMeshFace *p;
  ON__CNewMeshFace *x_local;
  ON_SimpleArray<ON__CNewMeshFace> *this_local;
  
  pOStack_20 = x;
  if (this->m_count == this->m_capacity) {
    iVar1 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOStack_20 = (ON__CNewMeshFace *)onmalloc(0x2c);
      memcpy(pOStack_20,x,0x2c);
    }
    Reserve(this,(long)iVar1);
    if (this->m_a == (ON__CNewMeshFace *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  memcpy(this->m_a + iVar1,pOStack_20,0x2c);
  if (pOStack_20 != x) {
    onfree(pOStack_20);
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}